

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

action __thiscall
Search::search::predictLDF
          (search *this,example *ecs,size_t ec_cnt,ptag mytag,action *oracle_actions,
          size_t oracle_actions_cnt,ptag *condition_on,char *condition_on_names,size_t learner_id,
          float weight)

{
  action_repr *paVar1;
  features *this_00;
  wclass *pwVar2;
  search_private *psVar3;
  action *pos;
  ulong uVar4;
  float loss;
  action_repr item;
  action a;
  float a_cost;
  action local_48;
  float local_44;
  action_repr local_40;
  
  local_44 = 0.0;
  pos = oracle_actions;
  local_48 = search_predict(this->priv,ecs,ec_cnt,mytag,oracle_actions,oracle_actions_cnt,
                            condition_on,condition_on_names,(action *)0x0,0,(float *)0x0,learner_id,
                            &local_44,condition_on._0_4_);
  if (this->priv->state == INIT_TEST) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->priv->test_action_sequence,&local_48);
  }
  if ((mytag != 0) &&
     (pwVar2 = ecs[local_48].l.cs.costs._begin, ecs[local_48].l.cs.costs._end != pwVar2)) {
    uVar4 = (ulong)mytag;
    psVar3 = this->priv;
    paVar1 = (psVar3->ptag_to_action)._begin;
    if (uVar4 < (ulong)((long)(psVar3->ptag_to_action)._end - (long)paVar1 >> 4)) {
      this_00 = paVar1[uVar4].repr;
      if (this_00 != (features *)0x0) {
        features::delete_v(this_00);
        operator_delete((this->priv->ptag_to_action)._begin[uVar4].repr);
        psVar3 = this->priv;
        pwVar2 = ecs[local_48].l.cs.costs._begin;
      }
    }
    action_repr::action_repr(&local_40,pwVar2->class_index,&psVar3->last_action_repr);
    item.repr._0_4_ = mytag;
    item._0_8_ = local_40.repr;
    item.repr._4_4_ = 0;
    push_at<Search::action_repr>
              ((Search *)&psVar3->ptag_to_action,(v_array<Search::action_repr> *)(ulong)local_40.a,
               item,(size_t)pos);
  }
  if (this->priv->auto_hamming_loss == true) {
    loss = action_hamming_loss(local_48,oracle_actions,oracle_actions_cnt);
    search::loss(this,loss);
  }
  return local_48;
}

Assistant:

action search::predictLDF(example* ecs, size_t ec_cnt, ptag mytag, const action* oracle_actions,
    size_t oracle_actions_cnt, const ptag* condition_on, const char* condition_on_names, size_t learner_id,
    float weight)
{
  float a_cost = 0.;
  // TODO: action costs for ldf
  action a = search_predict(*priv, ecs, ec_cnt, mytag, oracle_actions, oracle_actions_cnt, condition_on,
      condition_on_names, nullptr, 0, nullptr, learner_id, a_cost, weight);
  if (priv->state == INIT_TEST)
    priv->test_action_sequence.push_back(a);
  if ((mytag != 0) && ecs[a].l.cs.costs.size() > 0)
  {
    if (mytag < priv->ptag_to_action.size())
    {
      cdbg << "delete_v at " << mytag << endl;
      if (priv->ptag_to_action[mytag].repr != nullptr)
      {
        priv->ptag_to_action[mytag].repr->delete_v();
        delete priv->ptag_to_action[mytag].repr;
      }
    }
    push_at(priv->ptag_to_action, action_repr(ecs[a].l.cs.costs[0].class_index, &(priv->last_action_repr)), mytag);
  }
  if (priv->auto_hamming_loss)
    loss(action_hamming_loss(a, oracle_actions, oracle_actions_cnt));  // TODO: action costs
  cdbg << "predict returning " << a << endl;
  return a;
}